

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas3_d.cpp
# Opt level: O2

void dtrsm(char side,char uplo,char transa,char diag,int m,int n,double alpha,double *a,int lda,
          double *b,int ldb)

{
  char ca;
  uint i2;
  char ca_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  double *pdVar5;
  undefined7 in_register_00000009;
  ulong uVar6;
  undefined7 in_register_00000011;
  ulong uVar7;
  undefined7 in_register_00000039;
  ulong uVar8;
  long lVar9;
  double *pdVar10;
  ulong uVar11;
  double *pdVar12;
  long lVar13;
  ulong uVar14;
  double dVar15;
  string local_90;
  undefined4 local_6c;
  uint local_68;
  uint local_64;
  double local_60;
  allocator<char> local_51;
  ulong local_50;
  bool local_48;
  undefined7 uStack_47;
  long local_40;
  char local_32;
  char local_31;
  
  local_40 = CONCAT44(local_40._4_4_,(int)CONCAT71(in_register_00000011,transa));
  local_50 = CONCAT44(local_50._4_4_,(int)CONCAT71(in_register_00000039,side));
  local_60 = alpha;
  bVar1 = lsame(side,'L');
  local_6c = (undefined4)CONCAT71(in_register_00000009,diag);
  local_31 = lsame(diag,'N');
  bVar2 = lsame(uplo,'U');
  _local_48 = CONCAT71(uStack_47,bVar2);
  local_68 = m;
  local_64 = n;
  local_32 = bVar1;
  if (!bVar1) {
    bVar1 = lsame((char)local_50,'R');
    m = n;
    if (!bVar1) {
      iVar3 = 1;
      goto LAB_0020ffb6;
    }
  }
  if ((local_48 != false) || (bVar1 = lsame(uplo,'L'), bVar1)) {
    ca_00 = (char)local_40;
    bVar1 = lsame((char)local_40,'N');
    if ((bVar1) || ((bVar1 = lsame(ca_00,'T'), bVar1 || (bVar1 = lsame(ca_00,'C'), bVar1)))) {
      ca = (char)local_6c;
      bVar1 = lsame((char)local_6c,'U');
      if ((bVar1) || (bVar1 = lsame(ca,'N'), bVar1)) {
        i2 = local_68;
        if ((int)local_68 < 0) {
          iVar3 = 5;
        }
        else if ((int)local_64 < 0) {
          iVar3 = 6;
        }
        else {
          iVar3 = i4_max(1,m);
          if (lda < iVar3) {
            iVar3 = 9;
          }
          else {
            local_50 = CONCAT44(local_50._4_4_,1);
            iVar3 = i4_max(1,i2);
            if (iVar3 <= ldb) {
              if (local_64 == 0) {
                return;
              }
              local_40 = (long)ldb;
              uVar7 = (ulong)local_64;
              uVar14 = (ulong)i2;
              if ((local_60 == 0.0) && (!NAN(local_60))) {
                for (uVar4 = 0; uVar4 != uVar7; uVar4 = uVar4 + 1) {
                  for (uVar6 = 0; uVar14 != uVar6; uVar6 = uVar6 + 1) {
                    b[uVar6] = 0.0;
                  }
                  b = b + local_40;
                }
                return;
              }
              bVar1 = lsame(ca_00,'N');
              uVar4 = (ulong)lda;
              if (local_32 != '\0') {
                iVar3 = lda + 1;
                if (!bVar1) {
                  if (local_48 != false) {
                    pdVar5 = b;
                    for (uVar6 = 0; uVar6 != uVar7; uVar6 = uVar6 + 1) {
                      pdVar10 = a;
                      for (uVar8 = 0; uVar8 != uVar14; uVar8 = uVar8 + 1) {
                        dVar15 = b[uVar6 * local_40 + uVar8] * local_60;
                        for (uVar11 = 0; uVar8 != uVar11; uVar11 = uVar11 + 1) {
                          dVar15 = dVar15 - pdVar10[uVar11] * pdVar5[uVar11];
                        }
                        if (local_31 != '\0') {
                          dVar15 = dVar15 / a[iVar3 * (int)uVar8];
                        }
                        b[uVar6 * local_40 + uVar8] = dVar15;
                        pdVar10 = pdVar10 + uVar4;
                      }
                      pdVar5 = pdVar5 + local_40;
                    }
                    return;
                  }
                  pdVar5 = b + uVar14;
                  for (uVar6 = 0; uVar6 != uVar7; uVar6 = uVar6 + 1) {
                    pdVar10 = a + (uVar14 - 1) * uVar4 + uVar14;
                    pdVar12 = pdVar5;
                    uVar8 = uVar14;
                    while (0 < (long)uVar8) {
                      uVar11 = uVar8 - 1;
                      dVar15 = b[uVar6 * local_40 + uVar11] * local_60;
                      for (lVar9 = 0; (long)(uVar8 + lVar9) < (long)uVar14; lVar9 = lVar9 + 1) {
                        dVar15 = dVar15 - pdVar10[lVar9] * pdVar12[lVar9];
                      }
                      if (local_31 != '\0') {
                        dVar15 = dVar15 / a[iVar3 * (int)uVar11];
                      }
                      b[uVar6 * local_40 + uVar11] = dVar15;
                      pdVar12 = pdVar12 + -1;
                      pdVar10 = pdVar10 + ~uVar4;
                      uVar8 = uVar11;
                    }
                    pdVar5 = pdVar5 + local_40;
                  }
                  return;
                }
                if (local_48 != false) {
                  pdVar5 = b;
                  for (uVar6 = 0; uVar6 != uVar7; uVar6 = uVar6 + 1) {
                    if ((local_60 != 1.0) || (NAN(local_60))) {
                      for (uVar8 = 0; uVar14 != uVar8; uVar8 = uVar8 + 1) {
                        pdVar5[uVar8] = pdVar5[uVar8] * local_60;
                      }
                    }
                    lVar9 = uVar6 * local_40;
                    pdVar10 = a + (uVar14 - 1) * uVar4;
                    uVar8 = uVar14;
                    while (0 < (long)uVar8) {
                      uVar8 = uVar8 - 1;
                      dVar15 = b[lVar9 + uVar8];
                      if ((dVar15 != 0.0) || (NAN(dVar15))) {
                        if (local_31 != '\0') {
                          b[lVar9 + uVar8] = dVar15 / a[iVar3 * (int)uVar8];
                        }
                        for (lVar13 = 0; lVar13 < (long)uVar8; lVar13 = lVar13 + 1) {
                          pdVar5[lVar13] = pdVar5[lVar13] - b[lVar9 + uVar8] * pdVar10[lVar13];
                        }
                      }
                      pdVar10 = pdVar10 + -uVar4;
                    }
                    pdVar5 = pdVar5 + local_40;
                  }
                  return;
                }
                pdVar5 = b;
                for (uVar6 = 0; uVar6 != uVar7; uVar6 = uVar6 + 1) {
                  if ((local_60 != 1.0) || (NAN(local_60))) {
                    for (uVar8 = 0; uVar14 != uVar8; uVar8 = uVar8 + 1) {
                      pdVar5[uVar8] = pdVar5[uVar8] * local_60;
                    }
                  }
                  lVar9 = uVar6 * local_40;
                  pdVar10 = pdVar5;
                  pdVar12 = a;
                  for (uVar8 = 0; uVar8 != uVar14; uVar8 = uVar8 + 1) {
                    dVar15 = b[lVar9 + uVar8];
                    if ((dVar15 != 0.0) || (NAN(dVar15))) {
                      lVar13 = 1;
                      if (local_31 != '\0') {
                        b[lVar9 + uVar8] = dVar15 / a[iVar3 * (int)uVar8];
                      }
                      for (; uVar8 + lVar13 < uVar14; lVar13 = lVar13 + 1) {
                        pdVar10[lVar13] = pdVar10[lVar13] - b[lVar9 + uVar8] * pdVar12[lVar13];
                      }
                    }
                    pdVar12 = pdVar12 + uVar4 + 1;
                    pdVar10 = pdVar10 + 1;
                  }
                  pdVar5 = pdVar5 + local_40;
                }
                return;
              }
              iVar3 = lda + 1;
              if (!bVar1) {
                if (local_48 != false) {
                  pdVar5 = b + (uVar7 - 1) * local_40;
                  while (0 < (long)uVar7) {
                    uVar7 = uVar7 - 1;
                    if (local_31 != '\0') {
                      dVar15 = a[iVar3 * (int)uVar7];
                      for (uVar6 = 0; uVar14 != uVar6; uVar6 = uVar6 + 1) {
                        pdVar5[uVar6] = pdVar5[uVar6] * (1.0 / dVar15);
                      }
                    }
                    lVar9 = uVar7 * local_40;
                    pdVar10 = b;
                    for (lVar13 = 0; lVar13 < (long)uVar7; lVar13 = lVar13 + 1) {
                      dVar15 = a[uVar7 * uVar4 + lVar13];
                      if ((dVar15 != 0.0) || (NAN(dVar15))) {
                        for (uVar6 = 0; uVar14 != uVar6; uVar6 = uVar6 + 1) {
                          pdVar10[uVar6] = b[lVar9 + uVar6] * -dVar15 + pdVar10[uVar6];
                        }
                      }
                      pdVar10 = pdVar10 + local_40;
                    }
                    if ((local_60 != 1.0) || (NAN(local_60))) {
                      for (uVar6 = 0; uVar14 != uVar6; uVar6 = uVar6 + 1) {
                        b[lVar9 + uVar6] = b[lVar9 + uVar6] * local_60;
                      }
                    }
                    pdVar5 = pdVar5 + -local_40;
                  }
                  return;
                }
                pdVar5 = b;
                for (uVar6 = 0; uVar6 != uVar7; uVar6 = uVar6 + 1) {
                  if (local_31 != '\0') {
                    dVar15 = a[iVar3 * (int)uVar6];
                    for (uVar8 = 0; uVar14 != uVar8; uVar8 = uVar8 + 1) {
                      pdVar5[uVar8] = pdVar5[uVar8] * (1.0 / dVar15);
                    }
                  }
                  lVar9 = uVar6 * local_40;
                  lVar13 = (long)(int)local_50;
                  pdVar10 = (double *)(local_40 * 8 * lVar13 + (long)b);
                  for (; lVar13 < (long)uVar7; lVar13 = lVar13 + 1) {
                    dVar15 = a[uVar6 * uVar4 + lVar13];
                    if ((dVar15 != 0.0) || (NAN(dVar15))) {
                      for (uVar8 = 0; uVar14 != uVar8; uVar8 = uVar8 + 1) {
                        pdVar10[uVar8] = b[lVar9 + uVar8] * -dVar15 + pdVar10[uVar8];
                      }
                    }
                    pdVar10 = pdVar10 + local_40;
                  }
                  if ((local_60 != 1.0) || (NAN(local_60))) {
                    for (uVar8 = 0; uVar14 != uVar8; uVar8 = uVar8 + 1) {
                      b[lVar9 + uVar8] = b[lVar9 + uVar8] * local_60;
                    }
                  }
                  local_50 = (ulong)((int)local_50 + 1);
                  pdVar5 = pdVar5 + local_40;
                }
                return;
              }
              if (local_48 != false) {
                pdVar5 = b;
                for (uVar6 = 0; uVar6 != uVar7; uVar6 = uVar6 + 1) {
                  if ((local_60 != 1.0) || (NAN(local_60))) {
                    for (uVar8 = 0; uVar14 != uVar8; uVar8 = uVar8 + 1) {
                      pdVar5[uVar8] = pdVar5[uVar8] * local_60;
                    }
                  }
                  pdVar10 = b;
                  for (uVar8 = 0; uVar8 != uVar6; uVar8 = uVar8 + 1) {
                    if ((a[uVar6 * uVar4 + uVar8] != 0.0) || (NAN(a[uVar6 * uVar4 + uVar8]))) {
                      for (uVar11 = 0; uVar14 != uVar11; uVar11 = uVar11 + 1) {
                        pdVar5[uVar11] = pdVar5[uVar11] - a[uVar6 * uVar4 + uVar8] * pdVar10[uVar11]
                        ;
                      }
                    }
                    pdVar10 = pdVar10 + local_40;
                  }
                  if (local_31 != '\0') {
                    dVar15 = a[iVar3 * (int)uVar6];
                    for (uVar8 = 0; uVar14 != uVar8; uVar8 = uVar8 + 1) {
                      pdVar5[uVar8] = pdVar5[uVar8] * (1.0 / dVar15);
                    }
                  }
                  pdVar5 = pdVar5 + local_40;
                }
                return;
              }
              pdVar5 = b + (uVar7 - 1) * local_40;
              pdVar10 = b + local_40 * uVar7;
              uVar6 = uVar7;
              while (0 < (long)uVar6) {
                if ((local_60 != 1.0) || (NAN(local_60))) {
                  for (uVar8 = 0; uVar14 != uVar8; uVar8 = uVar8 + 1) {
                    pdVar5[uVar8] = pdVar5[uVar8] * local_60;
                  }
                }
                uVar8 = uVar6 - 1;
                pdVar12 = pdVar10;
                for (; (long)uVar6 < (long)uVar7; uVar6 = uVar6 + 1) {
                  if ((a[uVar8 * uVar4 + uVar6] != 0.0) || (NAN(a[uVar8 * uVar4 + uVar6]))) {
                    for (uVar11 = 0; uVar14 != uVar11; uVar11 = uVar11 + 1) {
                      pdVar5[uVar11] = pdVar5[uVar11] - a[uVar8 * uVar4 + uVar6] * pdVar12[uVar11];
                    }
                  }
                  pdVar12 = pdVar12 + local_40;
                }
                if (local_31 != '\0') {
                  dVar15 = a[iVar3 * (int)uVar8];
                  for (uVar6 = 0; uVar14 != uVar6; uVar6 = uVar6 + 1) {
                    pdVar5[uVar6] = pdVar5[uVar6] * (1.0 / dVar15);
                  }
                }
                pdVar5 = pdVar5 + -local_40;
                pdVar10 = pdVar10 + -local_40;
                uVar6 = uVar8;
              }
              return;
            }
            iVar3 = 0xb;
          }
        }
      }
      else {
        iVar3 = 4;
      }
    }
    else {
      iVar3 = 3;
    }
  }
  else {
    iVar3 = 2;
  }
LAB_0020ffb6:
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"DTRSM",&local_51);
  xerbla(&local_90,iVar3);
  std::__cxx11::string::~string((string *)&local_90);
  return;
}

Assistant:

void dtrsm ( char side, char uplo, char transa, char diag, int m, int n, 
  double alpha, double a[], int lda, double b[], int ldb )

//****************************************************************************80
//
//  Purpose:
//
//    DTRSM solves A*X=alpha*B or X*A=alpha*B, for triangular A, rectangular B.
//
//  Discussion:
//
//    DTRSM solves one of the matrix equations
//      op( A )*X = alpha*B,   
//    or
//      X*op( A ) = alpha*B,
//    where alpha is a scalar, X and B are m by n matrices, A is a unit, or
//    non-unit,  upper or lower triangular matrix  and  op( A )  is one  of
//      op( A ) = A   or   op( A ) = A'.
//    The matrix X is overwritten on B.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    07 April 2014
//
//  Author:
//
//    This C++ version by John Burkardt.
//
//  Parameters:
//
//    Input, char SIDE, specifies whether op( A ) appears on the left
//    or right of X as follows:
//    'L' or 'l': op( A )*X = alpha*B.
//    'R' or 'r': X*op( A ) = alpha*B.
//
//    Input, char UPLO, specifies whether the matrix A is an upper or
//    lower triangular matrix as follows:
//    'U' or 'u': A is an upper triangular matrix.
//    'L' or 'l': A is a lower triangular matrix.
//
//    Input, char TRANSA, specifies the form of op( A ) to be used in
//    the matrix multiplication as follows:
//    'N' or 'n': op( A ) = A.
//    'T' or 't': op( A ) = A'.
//    'C' or 'c': op( A ) = A'.
//
//    Input, char DIAG, specifies whether or not A is unit triangular
//    as follows:
//    'U' or 'u': A is assumed to be unit triangular.
//    'N' or 'n': A is not assumed to be unit triangular.
//
//    Input, int M, the number of rows of B.  0 <= M.
//
//    Input, int N, the number of columns of B.  0 <= N.
//
//    Input, double ALPHA, the scalar alpha.  When alpha is
//    0.0 then A is not referenced and B need not be set before entry.
//
//    Input, double A[LDA*K] where K is M when SIDE = 'L' or 'l'  
//    and K is N when SIDE = 'R' or 'r'.
//    Before entry  with  UPLO = 'U' or 'u',  the  leading  k by k
//    upper triangular part of the array  A must contain the upper
//    triangular matrix  and the strictly lower triangular part of
//    A is not referenced.
//    Before entry  with  UPLO = 'L' or 'l',  the  leading  k by k
//    lower triangular part of the array  A must contain the lower
//    triangular matrix  and the strictly upper triangular part of
//    A is not referenced.
//    Note that when  DIAG = 'U' or 'u',  the diagonal elements of
//    A  are not referenced either,  but are assumed to be  unity.
//
//    Input, int LDA, the first dimension of A as declared
//    in the calling (sub) program.  When  SIDE = 'L' or 'l'  then
//    LDA  must be at least  max( 1, m ),  when  SIDE = 'R' or 'r'
//    then LDA must be at least max( 1, n ).
//
//    Input/output, double B[LDB*N].
//    Before entry, the leading m by n part of the array B must
//    contain the right-hand side matrix B, and on exit is
//    overwritten by the solution matrix X.
//
//    Input, int LDB, the first dimension of B as declared
//    in the calling program.  LDB must be at least max ( 1, M ).
//
{
  int i;
  int info;
  int j;
  int k;
  bool lside;
  bool nounit;
  int nrowa;
  double temp;
  bool upper;
//
//  Test the input parameters.
//
  lside = lsame ( side, 'L' );

  if ( lside )
  {
    nrowa = m;
  }
  else
  {
    nrowa = n;
  }

  nounit = lsame ( diag, 'N' );
  upper = lsame ( uplo, 'U' );

  info = 0;

  if ( ( ! lside ) && ( ! lsame ( side, 'R' ) ) )
  {
    info = 1;
  }
  else if ( ( ! upper ) && ( ! lsame ( uplo, 'L' ) ) )
  {
    info = 2;
  }
  else if ( ( ! lsame ( transa, 'N' ) ) && 
            ( ! lsame ( transa, 'T' ) ) && 
            ( ! lsame ( transa, 'C' ) ) )
  {
    info = 3;
  }
  else if ( ( ! lsame ( diag, 'U' ) ) && ( ! lsame ( diag, 'N' ) ) )
  {
    info = 4;
  }
  else if ( m < 0 )
  {
    info = 5;
  }
  else if ( n < 0 )
  {
    info = 6;
  }
  else if ( lda < i4_max ( 1, nrowa ) )
  {
    info = 9;
  }
  else if ( ldb < i4_max ( 1, m ) )
  {
    info = 11;
  }

  if ( info != 0 ) 
  {
    xerbla ( "DTRSM", info );
    return;
  }
//
//  Quick return if possible.
//
  if ( n == 0 )
  {
    return;
  }
//
//  and when alpha is 0.0.
//
  if ( alpha == 0.0 )
  {
    for ( j = 0; j < n; j++ )
    {
      for ( i = 0; i < m; i++ )
      {
        b[i+j*ldb] = 0.0;
      }
    }
    return;
  }
//
//  Start the operations.
//
  if ( lside ) 
  {
//
//  Form  B := alpha*inv( a )*B.
//
    if ( lsame ( transa, 'N' ) )
    {
      if ( upper )
      {
        for ( j = 0; j < n; j++ )
        {
          if ( alpha != 1.0 )
          {
            for ( i = 0; i < m; i++ )
            {
              b[i+j*ldb] = alpha * b[i+j*ldb];
            }
          }
          for ( k = m - 1; 0 <= k; k-- )
          {
            if ( b[k+j*ldb] != 0.0 )
            {
              if ( nounit )
              {
                b[k+j*ldb] = b[k+j*ldb] / a[k+k*lda];
              }
              for ( i = 0; i < k; i++ )
              {
                b[i+j*ldb] = b[i+j*ldb] - b[k+j*ldb] * a[i+k*lda];
              }
            }
          }
        }
      }
      else
      {
        for ( j = 0; j < n; j++ )
        {
          if ( alpha != 1.0 )
          {
            for ( i = 0; i < m; i++ )
            {
              b[i+j*ldb] = alpha * b[i+j*ldb];
            }
          }
          for ( k = 0; k < m; k++ )
          {
            if ( b[k+j*ldb] != 0.0 )
            {
              if ( nounit )
              {
                b[k+j*ldb] = b[k+j*ldb] / a[k+k*lda];
              }
              for ( i = k + 1; i < m; i++ )
              {
                b[i+j*ldb] = b[i+j*ldb] - b[k+j*ldb] * a[i+k*lda];
              }
            }
          }
        }
      }
    }
//
//  Form  B := alpha*inv( A' )*B.
//
    else
    {
      if ( upper )
      {
        for ( j = 0; j < n; j++ )
        {
          for ( i = 0; i < m; i++ )
          {
            temp = alpha * b[i+j*ldb];
            for ( k = 0; k < i; k++ )
            {
              temp = temp - a[k+i*lda] * b[k+j*ldb];
            }
            if ( nounit )
            {
              temp = temp / a[i+i*lda];
            }
            b[i+j*ldb] = temp;
          }
        }
      }
      else
      {
        for ( j = 0; j < n; j++ )
        {
          for ( i = m - 1; 0 <= i; i-- )
          {
            temp = alpha * b[i+j*ldb];
            for ( k = i + 1; k < m; k++ )
            {
              temp = temp - a[k+i*lda] * b[k+j*ldb];
            }
            if ( nounit )
            {
              temp = temp / a[i+i*lda];
            }
            b[i+j*ldb] = temp;
          }
        }
      }
    }
  }
//
//  Form  B := alpha*B*inv( A ).
//
  else
  {
    if ( lsame ( transa, 'N' ) )
    {
      if ( upper )
      {
        for ( j = 0; j < n; j++ )
        {
          if ( alpha != 1.0 )
          {
            for ( i = 0; i < m; i++ )
            {
              b[i+j*ldb] = alpha * b[i+j*ldb];
            }
          }
          for ( k = 0; k < j; k++ )
          {
            if ( a[k+j*lda] != 0.0 )
            {
              for ( i = 0; i < m; i++ )
              {
                b[i+j*ldb] = b[i+j*ldb] - a[k+j*lda] * b[i+k*ldb];
              }
            }
          }
          if ( nounit )
          {
            temp = 1.0 / a[j+j*lda];
            for ( i = 0; i < m; i++ )
            {
              b[i+j*ldb] = temp * b[i+j*ldb];
            }
          }
        }
      }
      else
      {
        for ( j = n - 1; 0 <= j; j-- )
        {
          if ( alpha != 1.0 )
          {
            for ( i = 0; i < m; i++ )
            {
              b[i+j*ldb] = alpha * b[i+j*ldb];
            }
          }
          for ( k = j + 1; k < n; k++ )
          {
            if ( a[k+j*lda] != 0.0 )
            {
              for ( i = 0; i < m; i++ )
              {
                b[i+j*ldb] = b[i+j*ldb] - a[k+j*lda] * b[i+k*ldb];
              }
            }
          }
          if ( nounit )
          {
            temp = 1.0 / a[j+j*lda];
            for ( i = 0; i < m; i++ )
            {
              b[i+j*ldb] = temp * b[i+j*ldb];
            }
          }
        }
      }
    }
//
//  Form  B := alpha*B*inv( A' ).
//
    else
    {
      if ( upper )
      {
        for ( k = n - 1; 0 <= k; k-- )
        {
          if ( nounit )
          {
            temp = 1.0 / a[k+k*lda];
            for ( i = 0; i < m; i++ )
            {
              b[i+k*ldb] = temp * b[i+k*ldb];
            }
          }
          for ( j = 0; j < k; j++ )
          {
            if ( a[j+k*lda] != 0.0 )
            {
              temp = a[j+k*lda];
              for ( i = 0; i < m; i++ )
              {
                b[i+j*ldb] = b[i+j*ldb] - temp * b[i+k*ldb];
              }
            }
          }
          if ( alpha != 1.0 )
          {
            for ( i = 0; i < m; i++ )
            {
              b[i+k*ldb] = alpha * b[i+k*ldb];
            }
          }
        }
      }
      else
      {
        for ( k = 0; k < n; k++ )
        {
          if ( nounit )
          {
            temp = 1.0 / a[k+k*lda];
            for ( i = 0; i < m; i++ )
            {
              b[i+k*ldb] = temp * b[i+k*ldb];
            }
          }
          for ( j = k + 1; j < n; j++ )
          {
            if ( a[j+k*lda] != 0.0 )
            {
              temp = a[j+k*lda];
              for ( i = 0; i < m; i++ )
              {
                b[i+j*ldb] = b[i+j*ldb] - temp * b[i+k*ldb];
              }
            }
          }
          if ( alpha != 1.0 )
          {
            for ( i = 0; i < m; i++ )
            {
              b[i+k*ldb] = alpha * b[i+k*ldb];
            }
          }
        }
      }
    }
  }
  return;
}